

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median_filter.cc
# Opt level: O0

bool __thiscall
sptk::MedianFilter::Get(MedianFilter *this,vector<double,_std::allocator<double>_> *output)

{
  double dVar1;
  value_type vVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference this_00;
  const_reference pvVar6;
  reference pvVar7;
  vector<double,_std::allocator<double>_> *in_RSI;
  long *in_RDI;
  int half_size;
  int n;
  vector<double,_std::allocator<double>_> *input_vector;
  iterator __end2;
  iterator __begin2;
  deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  int num_valid_numbers;
  int num_magic_numbers;
  int m;
  int output_size;
  MedianFilter *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff08;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff20;
  int local_c4;
  int local_bc;
  int local_7c;
  _Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>
  local_50;
  long *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  vector<double,_std::allocator<double>_> *local_18;
  
  if (((*(byte *)(in_RDI + 5) & 1) == 0) ||
     (in_RSI == (vector<double,_std::allocator<double>_> *)0x0)) {
    return false;
  }
  local_18 = in_RSI;
  bVar3 = Forward(in_stack_fffffffffffffef8);
  if (!bVar3) {
    return false;
  }
  local_1c = (**(code **)(*in_RDI + 0x10))();
  sVar5 = std::vector<double,_std::allocator<double>_>::size(local_18);
  if (sVar5 != (long)local_1c) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20._M_current,
               (size_type)in_stack_ffffffffffffff18._M_current);
  }
  local_20 = 0;
  do {
    if (local_1c <= local_20) {
      iVar4 = (int)in_RDI[0x16];
      if (*(int *)((long)in_RDI + 0xc) / 2 <= iVar4) {
        in_stack_ffffffffffffff00 = *(int *)((long)in_RDI + 0xc) + 1;
        sVar5 = std::
                deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)0x107795);
        if ((int)sVar5 < in_stack_ffffffffffffff00) {
          return true;
        }
      }
      std::
      deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::pop_front((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)CONCAT44(iVar4,in_stack_ffffffffffffff00));
      return true;
    }
    local_24 = 0;
    local_28 = 0;
    local_30 = in_RDI + 0xc;
    std::
    deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::begin((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffef8);
    std::
    deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::end((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)in_stack_fffffffffffffef8);
    while (bVar3 = std::operator!=((_Self *)CONCAT44(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00),
                                   (_Self *)in_stack_fffffffffffffef8), bVar3) {
      this_00 = std::
                _Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>
                ::operator*(&local_50);
      if ((*(byte *)(in_RDI + 3) & 1) == 0) {
        local_bc = 0;
      }
      else {
        local_bc = local_20;
      }
      local_7c = local_bc;
      while( true ) {
        if ((*(byte *)(in_RDI + 3) & 1) == 0) {
          local_c4 = (int)in_RDI[1];
        }
        else {
          local_c4 = local_20;
        }
        if (local_c4 < local_7c) break;
        if ((*(byte *)((long)in_RDI + 0x19) & 1) == 0) {
LAB_00107510:
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_7c);
          vVar2 = *pvVar6;
          sVar5 = (size_type)local_28;
          local_28 = local_28 + 1;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),sVar5);
          *pvVar7 = vVar2;
        }
        else {
          dVar1 = (double)in_RDI[4];
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_7c);
          if ((dVar1 != *pvVar6) || (NAN(dVar1) || NAN(*pvVar6))) goto LAB_00107510;
          local_24 = local_24 + 1;
        }
        local_7c = local_7c + 1;
      }
      std::
      _Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>
      ::operator++((_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>
                    *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    }
    if (local_28 < local_24) {
      in_stack_ffffffffffffff20._M_current = (double *)in_RDI[4];
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_20);
      *pvVar7 = (value_type)in_stack_ffffffffffffff20._M_current;
    }
    else {
      iVar4 = local_28 / 2;
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef8);
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef8);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+(in_stack_ffffffffffffff08,
                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+(in_stack_ffffffffffffff08,
                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef8);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+(in_stack_ffffffffffffff08,
                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      std::
      partial_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      bVar3 = IsEven(local_28);
      if (bVar3) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),
                            (long)(iVar4 + -1));
        in_stack_ffffffffffffff10._M_current = (double *)*pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)iVar4);
        in_stack_ffffffffffffff18._M_current =
             (double *)(((double)in_stack_ffffffffffffff10._M_current + *pvVar7) * 0.5);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_20);
        *pvVar7 = (value_type)in_stack_ffffffffffffff18._M_current;
      }
      else {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)iVar4);
        in_stack_ffffffffffffff08 =
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)*pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_20);
        *pvVar7 = (value_type)in_stack_ffffffffffffff08;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool MedianFilter::Get(std::vector<double>* output) {
  if (!is_valid_ || NULL == output) {
    return false;
  }

  if (!Forward()) {
    return false;
  }

  const int output_size(GetSize());
  if (output->size() != static_cast<std::size_t>(output_size)) {
    output->resize(output_size);
  }

  for (int m(0); m < output_size; ++m) {
    int num_magic_numbers(0);
    int num_valid_numbers(0);
    for (const std::vector<double>& input_vector : queue_) {
      for (int n(apply_each_dimension_ ? m : 0);
           n <= (apply_each_dimension_ ? m : num_input_order_); ++n) {
        if (use_magic_number_ && magic_number_ == input_vector[n]) {
          ++num_magic_numbers;
        } else {
          flat_[num_valid_numbers++] = input_vector[n];
        }
      }
    }

    if (num_valid_numbers < num_magic_numbers) {
      (*output)[m] = magic_number_;
      continue;
    }

    const int half_size(num_valid_numbers / 2);
    std::partial_sort(flat_.begin(), flat_.begin() + half_size + 1,
                      flat_.begin() + num_valid_numbers);
    if (IsEven(num_valid_numbers)) {
      (*output)[m] = 0.5 * (flat_[half_size - 1] + flat_[half_size]);
    } else {
      (*output)[m] = flat_[half_size];
    }
  }

  if (count_down_ < num_filter_order_ / 2 ||
      num_filter_order_ + 1 <= static_cast<int>(queue_.size())) {
    queue_.pop_front();
  }

  return true;
}